

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

EncodingType httplib::detail::encoding_type(Request *req,Response *res)

{
  Response *this;
  bool bVar1;
  allocator local_c9;
  string local_c8;
  string local_a8;
  string *local_88;
  string *s;
  allocator local_69;
  string local_68;
  string local_48;
  undefined1 local_21;
  Response *pRStack_20;
  bool ret;
  Response *res_local;
  Request *req_local;
  
  pRStack_20 = res;
  res_local = (Response *)req;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"Content-Type",&local_69);
  Response::get_header_value(&local_48,res,&local_68,0);
  bVar1 = can_compress_content_type(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  this = res_local;
  if (bVar1) {
    local_21 = bVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"Accept-Encoding",&local_c9);
    Request::get_header_value(&local_a8,(Request *)this,&local_c8,0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    local_88 = &local_a8;
    req_local._4_4_ = None;
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    req_local._4_4_ = None;
  }
  return req_local._4_4_;
}

Assistant:

inline EncodingType encoding_type(const Request &req, const Response &res) {
  auto ret =
      detail::can_compress_content_type(res.get_header_value("Content-Type"));
  if (!ret) { return EncodingType::None; }

  const auto &s = req.get_header_value("Accept-Encoding");
  (void)(s);

#ifdef CPPHTTPLIB_BROTLI_SUPPORT
  // TODO: 'Accept-Encoding' has br, not br;q=0
  ret = s.find("br") != std::string::npos;
  if (ret) { return EncodingType::Brotli; }
#endif

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
  // TODO: 'Accept-Encoding' has gzip, not gzip;q=0
  ret = s.find("gzip") != std::string::npos;
  if (ret) { return EncodingType::Gzip; }
#endif

  return EncodingType::None;
}